

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

void __thiscall rsg::IntLiteral::tokenize(IntLiteral *this,GeneratorState *state,TokenStream *str)

{
  Token local_20;
  
  VariableType::getScalarType(TYPE_INT);
  local_20.m_arg.floatValue =
       (float)*(this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>
               ._M_impl.super__Vector_impl_data._M_start;
  local_20.m_type = INT_LITERAL;
  TokenStream::operator<<(str,&local_20);
  Token::~Token(&local_20);
  return;
}

Assistant:

void IntLiteral::tokenize (GeneratorState& state, TokenStream& str) const
{
	DE_UNREF(state);
	str << Token(m_value.getValue(VariableType::getScalarType(VariableType::TYPE_INT)).asInt(0));
}